

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StructurePatternSyntax::StructurePatternSyntax
          (StructurePatternSyntax *this,Token openBrace,
          SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *members,Token closeBrace
          )

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  StructurePatternMemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *in_stack_ffffffffffffffa0;
  
  PatternSyntax::PatternSyntax
            ((PatternSyntax *)in_stack_ffffffffffffffa0,(SyntaxKind)((ulong)in_RDI >> 0x20));
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].elements._M_ptr = in_R8;
  in_RDI[1].elements._M_extent._M_extent_value = in_R9;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x273166);
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<slang::syntax::StructurePatternMemberSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::StructurePatternMemberSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<slang::syntax::StructurePatternMemberSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<slang::syntax::StructurePatternMemberSyntax_*>,_false>
                      *)0x2731a5);
    *(SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> **)
     &(in_stack_ffffffffffffffa0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<slang::syntax::StructurePatternMemberSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<slang::syntax::StructurePatternMemberSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<slang::syntax::StructurePatternMemberSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

StructurePatternSyntax(Token openBrace, const SeparatedSyntaxList<StructurePatternMemberSyntax>& members, Token closeBrace) :
        PatternSyntax(SyntaxKind::StructurePattern), openBrace(openBrace), members(members), closeBrace(closeBrace) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }